

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * linearize_symbol_expression(Proc *proc,AstNode *expr)

{
  byte *pbVar1;
  SymbolType SVar2;
  uint uVar3;
  LuaSymbol *sym;
  Constant *constant;
  Pseudo *pPVar4;
  Pseudo *pPVar5;
  Pseudo *pPVar6;
  
  sym = (expr->field_2).symbol_expr.var;
  SVar2 = sym->symbol_type;
  if (SVar2 == SYM_LOCAL) {
    return (sym->field_1).variable.pseudo;
  }
  if (SVar2 == SYM_UPVALUE) {
    pPVar4 = allocate_symbol_pseudo(proc,sym,(uint)*(ushort *)((long)&sym->field_1 + 0x20));
    return pPVar4;
  }
  if (SVar2 == SYM_GLOBAL) {
    if ((sym->field_1).variable.env != (LuaSymbol *)0x0) {
      constant = allocate_string_constant(proc,(sym->field_1).variable.var_name);
      pPVar4 = allocate_constant_pseudo(proc,constant);
      pPVar5 = allocate_symbol_pseudo(proc,(sym->field_1).variable.env,0);
      if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x4d1,
                      "Pseudo *create_global_indexed_pseudo(Proc *, Pseudo *, Pseudo *, unsigned int)"
                     );
      }
      if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
        uVar3 = expr->line_number;
        pPVar6 = allocate_indexed_pseudo(proc);
        (pPVar6->field_3).index_info.line_number = uVar3;
        (pPVar6->field_3).symbol = (LuaSymbol *)0x101ffffffff;
        (pPVar6->field_3).index_info.container = pPVar5;
        (pPVar6->field_3).index_info.key = pPVar4;
        (pPVar6->field_3).index_info.target_type = RAVI_TANY;
        pbVar1 = (byte *)((long)&pPVar6->field_3 + 0xc);
        *pbVar1 = *pbVar1 | 1;
        return pPVar6;
      }
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x4d2,
                    "Pseudo *create_global_indexed_pseudo(Proc *, Pseudo *, Pseudo *, unsigned int)"
                   );
    }
  }
  else {
    handle_error(proc->linearizer->compiler_state,"feature not yet implemented");
  }
  __assert_fail("sym->variable.env",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x4f8,"Pseudo *linearize_symbol_expression(Proc *, AstNode *)");
}

Assistant:

static Pseudo *linearize_symbol_expression(Proc *proc, AstNode *expr)
{
	LuaSymbol *sym = expr->symbol_expr.var;
	if (sym->symbol_type == SYM_GLOBAL) {
		assert(sym->variable.env);
		const Constant *constant = allocate_string_constant(proc, sym->variable.var_name);
		Pseudo *operand_varname = allocate_constant_pseudo(proc, constant);
		Pseudo* operand_env = allocate_symbol_pseudo(proc, sym->variable.env, 0); // no register
		return create_global_indexed_pseudo(proc, operand_env, operand_varname, expr->line_number);
	} else if (sym->symbol_type == SYM_LOCAL) {
		return sym->variable.pseudo;
	} else if (sym->symbol_type == SYM_UPVALUE) {
		/* upvalue index is the position of upvalue in the function, we treat this as the pseudo register for
		 * the upvalue */
		return allocate_symbol_pseudo(proc, sym, sym->upvalue.upvalue_index);
	} else {
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		return NULL;
	}
}